

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AnalysisManager.cpp
# Opt level: O1

void __thiscall
slang::analysis::AnalysisManager::analyzeScopeAsync(AnalysisManager *this,Scope *scope)

{
  concurrent_map<const_ast::Scope_*,_std::optional<const_AnalyzedScope_*>_> *this_00;
  atomic<unsigned_long> *paVar1;
  mutex *__mutex;
  group_type_pointer pgVar2;
  insert_counter_type *piVar3;
  __int_type _Var4;
  __int_type_conflict1 _Var5;
  undefined4 uVar6;
  __int_type _Var7;
  uint uVar8;
  group_type_pointer pgVar9;
  value_type_pointer ppVar10;
  group_access_pointer pgVar11;
  ulong uVar12;
  _Map_pointer ppfVar13;
  undefined1 auVar14 [16];
  ushort uVar15;
  int iVar16;
  long lVar17;
  ulong uVar18;
  function<void_()> *pfVar19;
  _Elt_pointer pfVar20;
  ulong uVar21;
  long lVar22;
  ulong uVar23;
  uint k;
  uint uVar24;
  uint uVar25;
  bool bVar26;
  AnalysisManager *pAVar27;
  ulong uVar28;
  AnalysisManager *this_01;
  long lVar29;
  ulong uVar30;
  long in_FS_OFFSET;
  bool bVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  int local_b4;
  __int_type_conflict local_48;
  __int_type_conflict _Stack_47;
  __int_type_conflict _Stack_46;
  __int_type_conflict _Stack_45;
  
  this_00 = &this->analyzedScopes;
  uVar21 = (ulong)((this->analyzedScopes).table_.mutexes.mutexes.buf + 0x3f) & 0xffffffffffffffc0;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = scope;
  uVar23 = SUB168(auVar14 * ZEXT816(0x9e3779b97f4a7c15),8) ^
           SUB168(auVar14 * ZEXT816(0x9e3779b97f4a7c15),0);
  pAVar27 = this;
LAB_0016f808:
  if (*(char *)(in_FS_OFFSET + -0x28) == '\0') {
    LOCK();
    UNLOCK();
    iVar16 = (int)boost::unordered::detail::foa::
                  concurrent_table<boost::unordered::detail::foa::flat_map_types<slang::ast::Scope_const*,std::optional<slang::analysis::AnalyzedScope_const*>>,slang::hash<slang::ast::Scope_const*,void>,std::equal_to<slang::ast::Scope_const*>,std::allocator<std::pair<slang::ast::Scope_const*const,std::optional<slang::analysis::AnalyzedScope_const*>>>>
                  ::thread_counter;
    boost::unordered::detail::foa::
    concurrent_table<boost::unordered::detail::foa::flat_map_types<slang::ast::Scope_const*,std::optional<slang::analysis::AnalyzedScope_const*>>,slang::hash<slang::ast::Scope_const*,void>,std::equal_to<slang::ast::Scope_const*>,std::allocator<std::pair<slang::ast::Scope_const*const,std::optional<slang::analysis::AnalyzedScope_const*>>>>
    ::thread_counter =
         boost::unordered::detail::foa::
         concurrent_table<boost::unordered::detail::foa::flat_map_types<slang::ast::Scope_const*,std::optional<slang::analysis::AnalyzedScope_const*>>,slang::hash<slang::ast::Scope_const*,void>,std::equal_to<slang::ast::Scope_const*>,std::allocator<std::pair<slang::ast::Scope_const*const,std::optional<slang::analysis::AnalyzedScope_const*>>>>
         ::thread_counter + 1;
    *(ulong *)(in_FS_OFFSET + -0x30) = (ulong)(iVar16 + 1U & 0x7f);
    *(undefined1 *)(in_FS_OFFSET + -0x28) = 1;
  }
  lVar17 = *(long *)(in_FS_OFFSET + -0x30) * 0x40;
  uVar24 = 0;
  do {
    uVar25 = *(uint *)(lVar17 + uVar21);
    if (uVar25 < 0x3fffffff) {
      LOCK();
      bVar31 = uVar25 == *(uint *)(lVar17 + uVar21);
      if (bVar31) {
        *(uint *)(lVar17 + uVar21) = uVar25 + 1;
      }
      UNLOCK();
      if (bVar31) break;
    }
    pAVar27 = (AnalysisManager *)(ulong)uVar24;
    boost::unordered::detail::foa::rw_spinlock::yield(uVar24);
    uVar24 = uVar24 + 1;
  } while( true );
  uVar18 = uVar23 >> ((byte)(this_00->table_).
                            super_concurrent_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_slang::hash<const_slang::ast::Scope_*>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
                            .arrays.
                            super_table_arrays<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::atomic_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
                            .groups_size_index & 0x3f);
  local_b4 = 0xa5b640;
  uVar6 = *(undefined4 *)
           (boost::unordered::detail::foa::group15<boost::unordered::detail::foa::atomic_integral>::
            match_word(unsigned_long)::word + (uVar23 & 0xff) * 4);
LAB_0016f89c:
  _Var7 = (this->analyzedScopes).table_.
          super_concurrent_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_slang::hash<const_slang::ast::Scope_*>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
          .arrays.group_accesses_[uVar18].cnt.super___atomic_base<unsigned_int>._M_i;
  uVar28 = 0;
  uVar30 = uVar18;
LAB_0016f8b5:
  pgVar9 = (this->analyzedScopes).table_.
           super_concurrent_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_slang::hash<const_slang::ast::Scope_*>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
           .arrays.
           super_table_arrays<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::atomic_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
           .groups_;
  pgVar2 = pgVar9 + uVar30;
  local_48 = (__int_type_conflict)uVar6;
  _Stack_47 = (__int_type_conflict)((uint)uVar6 >> 8);
  _Stack_46 = (__int_type_conflict)((uint)uVar6 >> 0x10);
  _Stack_45 = (__int_type_conflict)((uint)uVar6 >> 0x18);
  auVar32[0] = -(pgVar2->m[0].n.super___atomic_base<unsigned_char>._M_i == local_48);
  auVar32[1] = -(pgVar2->m[1].n.super___atomic_base<unsigned_char>._M_i == _Stack_47);
  auVar32[2] = -(pgVar2->m[2].n.super___atomic_base<unsigned_char>._M_i == _Stack_46);
  auVar32[3] = -(pgVar2->m[3].n.super___atomic_base<unsigned_char>._M_i == _Stack_45);
  auVar32[4] = -(pgVar2->m[4].n.super___atomic_base<unsigned_char>._M_i == local_48);
  auVar32[5] = -(pgVar2->m[5].n.super___atomic_base<unsigned_char>._M_i == _Stack_47);
  auVar32[6] = -(pgVar2->m[6].n.super___atomic_base<unsigned_char>._M_i == _Stack_46);
  auVar32[7] = -(pgVar2->m[7].n.super___atomic_base<unsigned_char>._M_i == _Stack_45);
  auVar32[8] = -(pgVar2->m[8].n.super___atomic_base<unsigned_char>._M_i == local_48);
  auVar32[9] = -(pgVar2->m[9].n.super___atomic_base<unsigned_char>._M_i == _Stack_47);
  auVar32[10] = -(pgVar2->m[10].n.super___atomic_base<unsigned_char>._M_i == _Stack_46);
  auVar32[0xb] = -(pgVar2->m[0xb].n.super___atomic_base<unsigned_char>._M_i == _Stack_45);
  auVar32[0xc] = -(pgVar2->m[0xc].n.super___atomic_base<unsigned_char>._M_i == local_48);
  auVar32[0xd] = -(pgVar2->m[0xd].n.super___atomic_base<unsigned_char>._M_i == _Stack_47);
  auVar32[0xe] = -(pgVar2->m[0xe].n.super___atomic_base<unsigned_char>._M_i == _Stack_46);
  auVar32[0xf] = -(pgVar2->m[0xf].n.super___atomic_base<unsigned_char>._M_i == _Stack_45);
  uVar24 = (uint)(ushort)((ushort)(SUB161(auVar32 >> 7,0) & 1) |
                          (ushort)(SUB161(auVar32 >> 0xf,0) & 1) << 1 |
                          (ushort)(SUB161(auVar32 >> 0x17,0) & 1) << 2 |
                          (ushort)(SUB161(auVar32 >> 0x1f,0) & 1) << 3 |
                          (ushort)(SUB161(auVar32 >> 0x27,0) & 1) << 4 |
                          (ushort)(SUB161(auVar32 >> 0x2f,0) & 1) << 5 |
                          (ushort)(SUB161(auVar32 >> 0x37,0) & 1) << 6 |
                          (ushort)(SUB161(auVar32 >> 0x3f,0) & 1) << 7 |
                          (ushort)(SUB161(auVar32 >> 0x47,0) & 1) << 8 |
                          (ushort)(SUB161(auVar32 >> 0x4f,0) & 1) << 9 |
                          (ushort)(SUB161(auVar32 >> 0x57,0) & 1) << 10 |
                          (ushort)(SUB161(auVar32 >> 0x5f,0) & 1) << 0xb |
                          (ushort)(SUB161(auVar32 >> 0x67,0) & 1) << 0xc |
                          (ushort)(SUB161(auVar32 >> 0x6f,0) & 1) << 0xd |
                         (ushort)(SUB161(auVar32 >> 0x77,0) & 1) << 0xe);
  if (uVar24 != 0) {
    ppVar10 = (this->analyzedScopes).table_.
              super_concurrent_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_slang::hash<const_slang::ast::Scope_*>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
              .arrays.
              super_table_arrays<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::atomic_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
              .elements_;
    pgVar11 = (this->analyzedScopes).table_.
              super_concurrent_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_slang::hash<const_slang::ast::Scope_*>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
              .arrays.group_accesses_;
    uVar25 = 0;
    do {
      uVar8 = pgVar11[uVar30].m.state_.super___atomic_base<unsigned_int>._M_i;
      if (uVar8 < 0x3fffffff) {
        LOCK();
        bVar31 = uVar8 == pgVar11[uVar30].m.state_.super___atomic_base<unsigned_int>._M_i;
        if (bVar31) {
          pgVar11[uVar30].m.state_.super___atomic_base<unsigned_int>._M_i = uVar8 + 1;
        }
        UNLOCK();
        if (bVar31) goto LAB_0016f925;
      }
      boost::unordered::detail::foa::rw_spinlock::yield(uVar25);
      uVar25 = uVar25 + 1;
    } while( true );
  }
  goto LAB_0016f981;
LAB_0016f925:
  do {
    uVar25 = 0;
    if (uVar24 != 0) {
      for (; (uVar24 >> uVar25 & 1) == 0; uVar25 = uVar25 + 1) {
      }
    }
    if ((pgVar9[uVar30].m[uVar25].n.super___atomic_base<unsigned_char>._M_i == '\0') ||
       (ppVar10[uVar30 * 0xf + (ulong)uVar25].first != scope)) {
      uVar24 = uVar24 - 1 & uVar24;
      bVar31 = true;
    }
    else {
      bVar31 = false;
      pAVar27 = (AnalysisManager *)0x1;
    }
    if (!bVar31) {
      LOCK();
      pgVar11[uVar30].m.state_.super___atomic_base<unsigned_int>._M_i =
           pgVar11[uVar30].m.state_.super___atomic_base<unsigned_int>._M_i - 1;
      UNLOCK();
      goto LAB_0016f9a3;
    }
  } while (uVar24 != 0);
  LOCK();
  pgVar11[uVar30].m.state_.super___atomic_base<unsigned_int>._M_i =
       pgVar11[uVar30].m.state_.super___atomic_base<unsigned_int>._M_i - 1;
  UNLOCK();
  if (bVar31) {
LAB_0016f981:
    bVar31 = (*(byte *)((long)&boost::unordered::detail::foa::
                               group15<boost::unordered::detail::foa::atomic_integral>::
                               is_not_overflowed(unsigned_long)::shift + (ulong)((uint)uVar23 & 7))
             & pgVar9[uVar30].m[0xf].n.super___atomic_base<unsigned_char>._M_i) != 0;
    if (!bVar31) {
      pAVar27 = (AnalysisManager *)0x0;
    }
  }
  else {
LAB_0016f9a3:
    bVar31 = false;
  }
  lVar22 = 1;
  if (!bVar31) goto LAB_0016f9c4;
  uVar12 = (this->analyzedScopes).table_.
           super_concurrent_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_slang::hash<const_slang::ast::Scope_*>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
           .arrays.
           super_table_arrays<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::atomic_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
           .groups_size_mask;
  lVar29 = uVar30 + uVar28;
  uVar28 = uVar28 + 1;
  uVar30 = lVar29 + 1U & uVar12;
  if (uVar12 < uVar28) goto code_r0x0016f9c2;
  goto LAB_0016f8b5;
code_r0x0016f9c2:
  pAVar27 = (AnalysisManager *)0x0;
LAB_0016f9c4:
  bVar31 = false;
  iVar16 = 0;
  if (pAVar27 == (AnalysisManager *)0x0) {
    LOCK();
    paVar1 = &(this->analyzedScopes).table_.
              super_concurrent_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_slang::hash<const_slang::ast::Scope_*>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
              .size_ctrl.size;
    _Var5 = (paVar1->super___atomic_base<unsigned_long>)._M_i;
    (paVar1->super___atomic_base<unsigned_long>)._M_i =
         (paVar1->super___atomic_base<unsigned_long>)._M_i + 1;
    UNLOCK();
    if ((this->analyzedScopes).table_.
        super_concurrent_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_slang::hash<const_slang::ast::Scope_*>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
        .size_ctrl.ml.super___atomic_base<unsigned_long>._M_i < _Var5 + 1) {
      bVar26 = false;
      bVar31 = false;
      local_b4 = -1;
    }
    else {
      bVar26 = false;
      uVar30 = uVar18;
      while( true ) {
        pgVar9 = (this->analyzedScopes).table_.
                 super_concurrent_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_slang::hash<const_slang::ast::Scope_*>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
                 .arrays.
                 super_table_arrays<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::atomic_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
                 .groups_;
        this_01 = (AnalysisManager *)
                  ((this->analyzedScopes).table_.
                   super_concurrent_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_slang::hash<const_slang::ast::Scope_*>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
                   .arrays.group_accesses_ + uVar30);
        pAVar27 = this_01;
        boost::unordered::detail::foa::rw_spinlock::lock((rw_spinlock *)this_01);
        pgVar2 = pgVar9 + uVar30;
        auVar33[0] = -(pgVar2->m[0].n.super___atomic_base<unsigned_char>._M_i == '\0');
        auVar33[1] = -(pgVar2->m[1].n.super___atomic_base<unsigned_char>._M_i == '\0');
        auVar33[2] = -(pgVar2->m[2].n.super___atomic_base<unsigned_char>._M_i == '\0');
        auVar33[3] = -(pgVar2->m[3].n.super___atomic_base<unsigned_char>._M_i == '\0');
        auVar33[4] = -(pgVar2->m[4].n.super___atomic_base<unsigned_char>._M_i == '\0');
        auVar33[5] = -(pgVar2->m[5].n.super___atomic_base<unsigned_char>._M_i == '\0');
        auVar33[6] = -(pgVar2->m[6].n.super___atomic_base<unsigned_char>._M_i == '\0');
        auVar33[7] = -(pgVar2->m[7].n.super___atomic_base<unsigned_char>._M_i == '\0');
        auVar33[8] = -(pgVar2->m[8].n.super___atomic_base<unsigned_char>._M_i == '\0');
        auVar33[9] = -(pgVar2->m[9].n.super___atomic_base<unsigned_char>._M_i == '\0');
        auVar33[10] = -(pgVar2->m[10].n.super___atomic_base<unsigned_char>._M_i == '\0');
        auVar33[0xb] = -(pgVar2->m[0xb].n.super___atomic_base<unsigned_char>._M_i == '\0');
        auVar33[0xc] = -(pgVar2->m[0xc].n.super___atomic_base<unsigned_char>._M_i == '\0');
        auVar33[0xd] = -(pgVar2->m[0xd].n.super___atomic_base<unsigned_char>._M_i == '\0');
        auVar33[0xe] = -(pgVar2->m[0xe].n.super___atomic_base<unsigned_char>._M_i == '\0');
        auVar33[0xf] = -(pgVar2->m[0xf].n.super___atomic_base<unsigned_char>._M_i == '\0');
        uVar15 = (ushort)(SUB161(auVar33 >> 7,0) & 1) | (ushort)(SUB161(auVar33 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar33 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar33 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar33 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar33 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar33 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar33 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar33 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar33 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar33 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar33 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar33 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar33 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar33 >> 0x77,0) & 1) << 0xe;
        if (uVar15 == 0) {
          LOCK();
          pgVar9[uVar30].m[0xf].n.super___atomic_base<unsigned_char>._M_i =
               pgVar9[uVar30].m[0xf].n.super___atomic_base<unsigned_char>._M_i |
               '\x01' << ((byte)uVar23 & 7);
          UNLOCK();
          iVar16 = 0;
        }
        else {
          uVar24 = 0;
          if (uVar15 != 0) {
            for (; (uVar15 >> uVar24 & 1) == 0; uVar24 = uVar24 + 1) {
            }
          }
          uVar28 = (ulong)uVar24;
          pgVar9[uVar30].m[uVar28].n.super___atomic_base<unsigned_char>._M_i = local_48;
          LOCK();
          piVar3 = &(this->analyzedScopes).table_.
                    super_concurrent_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_slang::hash<const_slang::ast::Scope_*>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
                    .arrays.group_accesses_[uVar18].cnt;
          _Var4 = (piVar3->super___atomic_base<unsigned_int>)._M_i;
          (piVar3->super___atomic_base<unsigned_int>)._M_i =
               (piVar3->super___atomic_base<unsigned_int>)._M_i + 1;
          UNLOCK();
          iVar16 = 4;
          if (_Var4 == _Var7) {
            ppVar10 = (this->analyzedScopes).table_.
                      super_concurrent_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_slang::hash<const_slang::ast::Scope_*>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
                      .arrays.
                      super_table_arrays<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::atomic_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
                      .elements_;
            ppVar10[uVar30 * 0xf + uVar28].first = scope;
            ppVar10[uVar30 * 0xf + uVar28].second.
            super__Optional_base<const_slang::analysis::AnalyzedScope_*,_true,_true>._M_payload.
            super__Optional_payload_base<const_slang::analysis::AnalyzedScope_*>._M_engaged = false;
            bVar26 = true;
            pAVar27 = (AnalysisManager *)scope;
            iVar16 = 1;
            local_b4 = 1;
          }
          else {
            pgVar9[uVar30].m[uVar28].n.super___atomic_base<unsigned_char>._M_i = '\0';
          }
        }
        (this_01->options).flags.m_bits = 0;
        if (iVar16 != 0) break;
        uVar30 = uVar30 + lVar22 &
                 (this->analyzedScopes).table_.
                 super_concurrent_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_slang::hash<const_slang::ast::Scope_*>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
                 .arrays.
                 super_table_arrays<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::atomic_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
                 .groups_size_mask;
        lVar22 = lVar22 + 1;
      }
      bVar31 = iVar16 == 4;
    }
    iVar16 = local_b4;
    if (!bVar26) {
      LOCK();
      paVar1 = &(this->analyzedScopes).table_.
                super_concurrent_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_slang::hash<const_slang::ast::Scope_*>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
                .size_ctrl.size;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i - 1;
      UNLOCK();
    }
  }
  local_b4 = iVar16;
  if (!bVar31) goto LAB_0016fb14;
  goto LAB_0016f89c;
LAB_0016fb14:
  LOCK();
  *(int *)(lVar17 + uVar21) = *(int *)(lVar17 + uVar21) + -1;
  UNLOCK();
  if (-1 < local_b4) {
    if (local_b4 == 0) {
      return;
    }
    __mutex = &(this->threadPool).tasks_mutex;
    iVar16 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
    if (iVar16 != 0) {
      std::__throw_system_error(iVar16);
    }
    pfVar20 = (this->threadPool).tasks.c.
              super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (pfVar20 ==
        *(_Elt_pointer *)
         ((long)&(this->threadPool).tasks.c.
                 super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish + 0x10) + -1) {
      ppfVar13 = *(_Map_pointer *)
                  ((long)&(this->threadPool).tasks.c.
                          super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>
                          ._M_impl.super__Deque_impl_data._M_finish + 0x18);
      if (((long)*(_Elt_pointer *)
                  ((long)&(this->threadPool).tasks.c.
                          super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>
                          ._M_impl.super__Deque_impl_data._M_start + 0x10) -
           (long)(this->threadPool).tasks.c.
                 super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_cur >> 5) +
          ((long)pfVar20 -
           (long)*(_Elt_pointer *)
                  ((long)&(this->threadPool).tasks.c.
                          super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>
                          ._M_impl.super__Deque_impl_data._M_finish + 8) >> 5) +
          ((((ulong)((long)ppfVar13 -
                    (long)*(_Map_pointer *)
                           ((long)&(this->threadPool).tasks.c.
                                   super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>
                                   ._M_impl.super__Deque_impl_data._M_start + 0x18)) >> 3) - 1) +
          (ulong)(ppfVar13 == (_Map_pointer)0x0)) * 0x10 == 0x7ffffffffffffff) {
        std::__throw_length_error("cannot create std::deque larger than max_size()");
      }
      if ((this->threadPool).tasks.c.
          super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
          _M_impl.super__Deque_impl_data._M_map_size -
          ((long)ppfVar13 -
           (long)(this->threadPool).tasks.c.
                 super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>
                 ._M_impl.super__Deque_impl_data._M_map >> 3) < 2) {
        std::deque<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::
        _M_reallocate_map(&(this->threadPool).tasks.c,1,false);
      }
      pfVar19 = (function<void_()> *)operator_new(0x200);
      (*(_Map_pointer *)
        ((long)&(this->threadPool).tasks.c.
                super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
                _M_impl.super__Deque_impl_data._M_finish + 0x18))[1] = pfVar19;
      pfVar20 = (this->threadPool).tasks.c.
                super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_cur;
      (pfVar20->super__Function_base)._M_functor = (_Any_data)0x0;
      *(undefined1 (*) [16])&(pfVar20->super__Function_base)._M_manager = (undefined1  [16])0x0;
      *(AnalysisManager **)&(pfVar20->super__Function_base)._M_functor = this;
      *(Scope **)((long)&(pfVar20->super__Function_base)._M_functor + 8) = scope;
      pfVar20->_M_invoker =
           std::
           _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/source/analysis/AnalysisManager.cpp:149:32)>
           ::_M_invoke;
      (pfVar20->super__Function_base)._M_manager =
           std::
           _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/source/analysis/AnalysisManager.cpp:149:32)>
           ::_M_manager;
      ppfVar13 = *(_Map_pointer *)
                  ((long)&(this->threadPool).tasks.c.
                          super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>
                          ._M_impl.super__Deque_impl_data._M_finish + 0x18);
      *(_Map_pointer *)
       ((long)&(this->threadPool).tasks.c.
               super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
               _M_impl.super__Deque_impl_data._M_finish + 0x18) = ppfVar13 + 1;
      pfVar20 = ppfVar13[1];
      *(_Elt_pointer *)
       ((long)&(this->threadPool).tasks.c.
               super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
               _M_impl.super__Deque_impl_data._M_finish + 8) = pfVar20;
      *(_Elt_pointer *)
       ((long)&(this->threadPool).tasks.c.
               super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
               _M_impl.super__Deque_impl_data._M_finish + 0x10) = pfVar20 + 0x10;
    }
    else {
      (pfVar20->super__Function_base)._M_functor = (_Any_data)0x0;
      *(undefined1 (*) [16])&(pfVar20->super__Function_base)._M_manager = (undefined1  [16])0x0;
      *(AnalysisManager **)&(pfVar20->super__Function_base)._M_functor = this;
      *(Scope **)((long)&(pfVar20->super__Function_base)._M_functor + 8) = scope;
      pfVar20->_M_invoker =
           std::
           _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/source/analysis/AnalysisManager.cpp:149:32)>
           ::_M_invoke;
      (pfVar20->super__Function_base)._M_manager =
           std::
           _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/source/analysis/AnalysisManager.cpp:149:32)>
           ::_M_manager;
      pfVar20 = (this->threadPool).tasks.c.
                super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
    }
    (this->threadPool).tasks.c.
    super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
    super__Deque_impl_data._M_finish._M_cur = pfVar20;
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    std::_V2::condition_variable_any::notify_one(&(this->threadPool).task_available_cv);
    return;
  }
  pAVar27 = (AnalysisManager *)this_00;
  boost::unordered::detail::foa::
  concurrent_table<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Scope_*,_std::optional<const_slang::analysis::AnalyzedScope_*>_>,_slang::hash<const_slang::ast::Scope_*,_void>,_std::equal_to<const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::ast::Scope_*const,_std::optional<const_slang::analysis::AnalyzedScope_*>_>_>_>
  ::rehash_if_full(&this_00->table_);
  goto LAB_0016f808;
}

Assistant:

void AnalysisManager::analyzeScopeAsync(const Scope& scope) {
    // Kick off a new analysis task if we haven't already seen
    // this scope before.
    if (analyzedScopes.try_emplace(&scope, std::nullopt)) {
        threadPool.detach_task([this, &scope] {
            SLANG_TRY {
                auto& result = analyzeScopeBlocking(scope);
                analyzedScopes.visit(&scope, [&result](auto& item) { item.second = &result; });
            }
            SLANG_CATCH(...) {
                std::unique_lock<std::mutex> lock(mutex);
                pendingException = std::current_exception();
            }
        });
    }